

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_math_modf(jit_State *J,RecordFFData *rd)

{
  uint tr_00;
  IRRef1 IVar1;
  TRef TVar2;
  jit_State *in_RSI;
  jit_State *in_RDI;
  TRef trt;
  TRef tr;
  undefined2 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe2;
  undefined2 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  
  tr_00 = *in_RDI->base;
  if ((tr_00 >> 0x18 & 0x1f) - 0xf < 5) {
    *in_RDI->base = tr_00;
    TVar2 = lj_ir_kint((jit_State *)
                       CONCAT26(in_stack_ffffffffffffffe6,
                                CONCAT24(in_stack_ffffffffffffffe4,
                                         CONCAT22(in_stack_ffffffffffffffe2,
                                                  in_stack_ffffffffffffffe0))),
                       (int32_t)((ulong)in_RDI >> 0x20));
    in_RDI->base[1] = TVar2;
  }
  else {
    TVar2 = lj_ir_tonum(in_RSI,tr_00);
    IVar1 = (IRRef1)TVar2;
    (in_RDI->fold).ins.field_0.ot = 0x340e;
    (in_RDI->fold).ins.field_0.op1 = IVar1;
    (in_RDI->fold).ins.field_0.op2 = 2;
    TVar2 = lj_opt_fold(in_RDI);
    *in_RDI->base = TVar2;
    (in_RDI->fold).ins.field_0.ot = 0x290e;
    (in_RDI->fold).ins.field_0.op1 = IVar1;
    (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold(in_RDI);
    in_RDI->base[1] = TVar2;
  }
  (in_RSI->cur).nins = 2;
  (in_RSI->cur).gclist = 0;
  return;
}

Assistant:

static void LJ_FASTCALL recff_math_modf(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tref_isinteger(tr)) {
    J->base[0] = tr;
    J->base[1] = lj_ir_kint(J, 0);
  } else {
    TRef trt;
    tr = lj_ir_tonum(J, tr);
    trt = emitir(IRTN(IR_FPMATH), tr, IRFPM_TRUNC);
    J->base[0] = trt;
    J->base[1] = emitir(IRTN(IR_SUB), tr, trt);
  }
  rd->nres = 2;
}